

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool gen_shift(DisasContext_conflict12 *ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  uintptr_t o_4;
  TCGv_i64 pTVar2;
  TCGOpcode TVar3;
  uintptr_t o_3;
  TCGv_i64 pTVar4;
  
  a1 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  pTVar4 = (TCGv_i64)((long)a1 - (long)ctx);
  a1_00 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_00c727eb:
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else {
    pTVar2 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs1];
    if (pTVar2 != pTVar4) {
      pTVar2 = pTVar2 + (long)&(ctx->base).tb;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_00c727eb;
    }
  }
  pTVar2 = (TCGv_i64)((long)a1_00 - (long)ctx);
  if ((long)a->rs2 == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs2];
    if (pTVar1 == pTVar2) goto LAB_00c7282f;
    pTVar1 = pTVar1 + (long)ctx;
    TVar3 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,TVar3,(TCGArg)a1_00,(TCGArg)pTVar1);
LAB_00c7282f:
  tcg_gen_andi_i64_riscv64((TCGContext_conflict11 *)ctx,pTVar2,pTVar2,0x3f);
  (*func)((TCGContext_conflict11 *)ctx,pTVar4,pTVar4,pTVar2);
  if (((long)a->rd != 0) && (pTVar1 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rd], pTVar1 != pTVar4)
     ) {
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,INDEX_op_mov_i64,
                        (TCGArg)(pTVar1 + (long)&(ctx->base).tb),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(pTVar4 + (long)ctx));
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(pTVar2 + (long)ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_shift(DisasContext *s1, int op, MemOp ot, int d, int s)
{
    if (s != OR_TMP1)
        gen_op_mov_v_reg(s1, ot, s1->T1, s);
    switch(op) {
    case OP_ROL:
        gen_rot_rm_T1(s1, ot, d, 0);
        break;
    case OP_ROR:
        gen_rot_rm_T1(s1, ot, d, 1);
        break;
    case OP_SHL:
    case OP_SHL1:
        gen_shift_rm_T1(s1, ot, d, 0, 0);
        break;
    case OP_SHR:
        gen_shift_rm_T1(s1, ot, d, 1, 0);
        break;
    case OP_SAR:
        gen_shift_rm_T1(s1, ot, d, 1, 1);
        break;
    case OP_RCL:
        gen_rotc_rm_T1(s1, ot, d, 0);
        break;
    case OP_RCR:
        gen_rotc_rm_T1(s1, ot, d, 1);
        break;
    }
}